

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubgraphNode.h
# Opt level: O2

void __thiscall
dg::SubgraphNode<dg::pta::PSNode>::removeAllOperands(SubgraphNode<dg::pta::PSNode> *this)

{
  pointer ppPVar1;
  pointer ppPVar2;
  
  ppPVar1 = (this->operands).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppPVar2 = (this->operands).
                 super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar2 != ppPVar1; ppPVar2 = ppPVar2 + 1) {
    removeUser(&(*ppPVar2)->super_SubgraphNode<dg::pta::PSNode>,(PSNode *)&this[-1].size);
  }
  ppPVar2 = (this->operands).
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->operands).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppPVar2) {
    (this->operands).super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = ppPVar2;
  }
  return;
}

Assistant:

void removeAllOperands() {
        for (auto *o : operands) {
            o->removeUser(static_cast<NodeT *>(this));
        }
        operands.clear();
    }